

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O2

Status unpack(Header *header,FILE *ifp,FILE *ofp)

{
  Byte BVar1;
  Ferror FVar2;
  Status SVar3;
  Word WVar4;
  char *fmt;
  bool bVar5;
  
  WVar4 = header->complen;
  init_garble();
  crc = 0;
  running = 0;
  while ((bVar5 = WVar4 != 0, WVar4 = WVar4 - 1, bVar5 &&
         (FVar2 = check_stream(ifp), FVar2 == FNOERR))) {
    BVar1 = read_byte(ifp);
    BVar1 = ungarble(BVar1);
    putc_ncr(ofp,BVar1);
  }
  FVar2 = check_stream(ifp);
  if (FVar2 == FRWERR) {
    SVar3 = RERR;
  }
  else if ((testing == '\0') && (FVar2 = check_stream(ofp), FVar2 == FRWERR)) {
    SVar3 = WERR;
  }
  else if (header->crc == (Halfword)crc) {
    fmt = "OK (packed)";
    if (testing == '\0') {
      fmt = "unpacked";
    }
    SVar3 = NOERR;
    msg(fmt);
  }
  else {
    SVar3 = CRCERR;
  }
  return SVar3;
}

Assistant:

Status
unpack(Header *header, FILE *ifp, FILE *ofp)
{
	register Word len = header->complen;

    init_garble();

	crc = 0;
	putc_init();
	while (len--)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		putc_ncr(ofp, ungarble(read_byte(ifp)));
	}

	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		msg("OK (packed)");
	else
		msg("unpacked");
	return (NOERR);
}